

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkMethod
          (DescriptorBuilder *this,MethodDescriptor *method,MethodDescriptorProto *proto)

{
  string *psVar1;
  MethodOptions *pMVar2;
  Symbol SVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (*(long *)(method + 0x28) == 0) {
    pMVar2 = MethodOptions::default_instance();
    *(MethodOptions **)(method + 0x28) = pMVar2;
  }
  SVar3 = LookupSymbol(this,proto->input_type_,*(string **)(method + 8),PLACEHOLDER_MESSAGE,
                       LOOKUP_ALL);
  if (SVar3.type == MESSAGE) {
    *(anon_union_8_7_bfa3a334_for_Symbol_2 *)(method + 0x18) = SVar3.field_1;
  }
  else if (SVar3.type == NULL_SYMBOL) {
    AddNotDefinedError(this,*(string **)(method + 8),&proto->super_Message,INPUT_TYPE,
                       proto->input_type_);
  }
  else {
    psVar1 = *(string **)(method + 8);
    std::operator+(&local_48,"\"",proto->input_type_);
    std::operator+(&bStack_68,&local_48,"\" is not a message type.");
    AddError(this,psVar1,&proto->super_Message,INPUT_TYPE,&bStack_68);
    std::__cxx11::string::~string((string *)&bStack_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  SVar3 = LookupSymbol(this,proto->output_type_,*(string **)(method + 8),PLACEHOLDER_MESSAGE,
                       LOOKUP_ALL);
  if (SVar3.type == MESSAGE) {
    *(anon_union_8_7_bfa3a334_for_Symbol_2 *)(method + 0x20) = SVar3.field_1;
  }
  else if (SVar3.type == NULL_SYMBOL) {
    AddNotDefinedError(this,*(string **)(method + 8),&proto->super_Message,OUTPUT_TYPE,
                       proto->output_type_);
  }
  else {
    psVar1 = *(string **)(method + 8);
    std::operator+(&local_48,"\"",proto->output_type_);
    std::operator+(&bStack_68,&local_48,"\" is not a message type.");
    AddError(this,psVar1,&proto->super_Message,OUTPUT_TYPE,&bStack_68);
    std::__cxx11::string::~string((string *)&bStack_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkMethod(
    MethodDescriptor* method, const MethodDescriptorProto& proto) {
  if (method->options_ == NULL) {
    method->options_ = &MethodOptions::default_instance();
  }

  Symbol input_type = LookupSymbol(proto.input_type(), method->full_name());
  if (input_type.IsNull()) {
    AddNotDefinedError(method->full_name(), proto,
                       DescriptorPool::ErrorCollector::INPUT_TYPE,
                       proto.input_type());
  } else if (input_type.type != Symbol::MESSAGE) {
    AddError(method->full_name(), proto,
             DescriptorPool::ErrorCollector::INPUT_TYPE,
             "\"" + proto.input_type() + "\" is not a message type.");
  } else {
    method->input_type_ = input_type.descriptor;
  }

  Symbol output_type = LookupSymbol(proto.output_type(), method->full_name());
  if (output_type.IsNull()) {
    AddNotDefinedError(method->full_name(), proto,
                       DescriptorPool::ErrorCollector::OUTPUT_TYPE,
                       proto.output_type());
  } else if (output_type.type != Symbol::MESSAGE) {
    AddError(method->full_name(), proto,
             DescriptorPool::ErrorCollector::OUTPUT_TYPE,
             "\"" + proto.output_type() + "\" is not a message type.");
  } else {
    method->output_type_ = output_type.descriptor;
  }
}